

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result-c.cpp
# Opt level: O0

void duckdb::WriteData<double,double,duckdb::CStandardConverter>
               (duckdb_column *column,ColumnDataCollection *source,
               vector<unsigned_long,_true> *column_ids)

{
  bool bVar1;
  DataChunk *this;
  double *pdVar2;
  idx_t iVar3;
  ColumnDataCollection *in_RSI;
  long *in_RDI;
  idx_t k;
  ValidityMask *mask;
  double *source_1;
  DataChunk *input;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterationHelper *__range2;
  double *target;
  idx_t row;
  vector<unsigned_long,_true> *in_stack_fffffffffffffdc8;
  ColumnDataChunkIterator *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  ColumnDataChunkIterationHelper *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  ulong local_1d8;
  ColumnDataChunkIterator local_1b8;
  ColumnDataChunkIterator local_118;
  undefined1 local_50 [32];
  undefined1 *local_30;
  long local_28;
  long local_20;
  
  local_20 = 0;
  local_28 = *in_RDI;
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  ColumnDataCollection::Chunks
            (in_RSI,(vector<unsigned_long,_true> *)
                    CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x192498b);
  local_30 = local_50;
  ColumnDataChunkIterationHelper::begin(in_stack_fffffffffffffe08);
  ColumnDataChunkIterationHelper::end(in_stack_fffffffffffffe08);
  while( true ) {
    bVar1 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                      (&local_118,&local_1b8);
    if (!bVar1) break;
    this = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                     ((ColumnDataChunkIterator *)0x1924aab);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffdd0,
               (size_type)in_stack_fffffffffffffdc8);
    pdVar2 = FlatVector::GetData<double>((Vector *)0x1924adb);
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffdd0,
               (size_type)in_stack_fffffffffffffdc8);
    FlatVector::Validity((Vector *)0x1924b0b);
    local_1d8 = 0;
    while( true ) {
      iVar3 = DataChunk::size(this);
      if (iVar3 <= local_1d8) break;
      in_stack_fffffffffffffddf =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     ((TemplatedValidityMask<unsigned_long> *)
                      CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                      (idx_t)in_stack_fffffffffffffdd0);
      if ((bool)in_stack_fffffffffffffddf) {
        in_stack_fffffffffffffdd0 =
             (ColumnDataChunkIterator *)
             CStandardConverter::Convert<double,double>(pdVar2[local_1d8]);
        *(ColumnDataChunkIterator **)(local_28 + local_20 * 8) = in_stack_fffffffffffffdd0;
      }
      else {
        CBaseConverter::NullConvert<double>((double *)(local_28 + local_20 * 8));
      }
      local_1d8 = local_1d8 + 1;
      local_20 = local_20 + 1;
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(in_stack_fffffffffffffdd0);
  }
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
            (in_stack_fffffffffffffdd0);
  ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
            (in_stack_fffffffffffffdd0);
  ColumnDataChunkIterationHelper::~ColumnDataChunkIterationHelper
            ((ColumnDataChunkIterationHelper *)0x1924a1b);
  return;
}

Assistant:

void WriteData(duckdb_column *column, ColumnDataCollection &source, const vector<column_t> &column_ids) {
	idx_t row = 0;
	auto target = (DST *)column->deprecated_data;
	for (auto &input : source.Chunks(column_ids)) {
		auto source = FlatVector::GetData<SRC>(input.data[0]);
		auto &mask = FlatVector::Validity(input.data[0]);

		for (idx_t k = 0; k < input.size(); k++, row++) {
			if (!mask.RowIsValid(k)) {
				OP::template NullConvert<DST>(target[row]);
			} else {
				target[row] = OP::template Convert<SRC, DST>(source[k]);
			}
		}
	}
}